

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O0

Var __thiscall ScriptMemoryDumper::Dump(ScriptMemoryDumper *this)

{
  Recycler *this_00;
  HeapInfo *this_01;
  ulong uVar1;
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket;
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket_00;
  BucketType *heapBucket_01;
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *heapBucket_02;
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *heapBucket_03;
  BucketType *heapBucket_04;
  size_t sizeCat_1;
  uint32 i_1;
  size_t sizeCat;
  uint32 i;
  HeapInfo *heapInfo;
  Recycler *recycler;
  ScriptMemoryDumper *this_local;
  
  this_00 = Js::ScriptContext::GetRecycler(this->scriptContext);
  this_01 = Memory::Recycler::GetDefaultHeapInfo(this_00);
  for (sizeCat._4_4_ = 0; sizeCat._4_4_ < 0x30; sizeCat._4_4_ = sizeCat._4_4_ + 1) {
    ResetCurrentStats(this);
    uVar1 = (ulong)((sizeCat._4_4_ + 1) * 0x10);
    heapBucket = &Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)32>(this_01,uVar1)->
                  super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>;
    DumpHeapBucket<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
              (this,sizeCat._4_4_,heapBucket);
    heapBucket_00 =
         (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
         Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)0>(this_01,uVar1);
    DumpHeapBucket<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
              (this,sizeCat._4_4_,heapBucket_00);
    heapBucket_01 = Memory::HeapInfo::GetBucket<(Memory::ObjectInfoBits)128>(this_01,uVar1);
    DumpHeapBucket<SmallAllocationBlockAttributes>(this,sizeCat._4_4_,heapBucket_01);
    SaveCurrentAtIndex(this,sizeCat._4_4_);
    MergeCurrentStats(this);
  }
  for (sizeCat_1._4_4_ = 0; sizeCat_1._4_4_ < 0x1d; sizeCat_1._4_4_ = sizeCat_1._4_4_ + 1) {
    ResetCurrentStats(this);
    uVar1 = (ulong)((sizeCat_1._4_4_ + 1) * 0x10 + 0x300);
    heapBucket_02 =
         &Memory::HeapInfo::GetMediumBucket<(Memory::ObjectInfoBits)32>(this_01,uVar1)->
          super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>;
    DumpHeapBucket<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
              (this,sizeCat_1._4_4_,heapBucket_02);
    heapBucket_03 =
         (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *)
         Memory::HeapInfo::GetMediumBucket<(Memory::ObjectInfoBits)0>(this_01,uVar1);
    DumpHeapBucket<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
              (this,sizeCat_1._4_4_,heapBucket_03);
    heapBucket_04 = Memory::HeapInfo::GetMediumBucket<(Memory::ObjectInfoBits)128>(this_01,uVar1);
    DumpHeapBucket<MediumAllocationBlockAttributes>(this,sizeCat_1._4_4_,heapBucket_04);
    SaveCurrentAtIndex(this,sizeCat_1._4_4_ + 0x30);
    MergeCurrentStats(this);
  }
  ResetCurrentStats(this);
  DumpLargeBucket(this,&this_01->largeObjectBucket);
  SaveCurrentAsLargeBlock(this);
  MergeCurrentStats(this);
  SaveSummary(this);
  return this->dumpObject;
}

Assistant:

Js::Var ScriptMemoryDumper::Dump()
{
    Recycler* recycler = scriptContext->GetRecycler();
    HeapInfo* heapInfo = recycler->GetDefaultHeapInfo();

    for (uint32 i = 0 ; i < HeapConstants::BucketCount; i++)
    {
        ResetCurrentStats();
        size_t sizeCat = (i + 1) * HeapConstants::ObjectGranularity;
        DumpHeapBucket(i, &heapInfo->GetBucket<LeafBit>(sizeCat));
        DumpHeapBucket(i, &heapInfo->GetBucket<NoBit>(sizeCat));
        DumpHeapBucket(i, (SmallFinalizableHeapBucket *)&heapInfo->GetBucket<FinalizeBit>(sizeCat));
        SaveCurrentAtIndex(i);
        MergeCurrentStats();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint32 i = 0 ; i < HeapConstants::MediumBucketCount; i++)
    {
        ResetCurrentStats();
        size_t sizeCat = HeapConstants::MaxSmallObjectSize + ((i + 1) * HeapConstants::ObjectGranularity);

#if SMALLBLOCK_MEDIUM_ALLOC
        DumpHeapBucket(i, &heapInfo->GetMediumBucket<LeafBit>(sizeCat));
        DumpHeapBucket(i, &heapInfo->GetMediumBucket<NoBit>(sizeCat));
        DumpHeapBucket(i, (MediumFinalizableHeapBucket *)&heapInfo->GetMediumBucket<FinalizeBit>(sizeCat));
#else
        DumpLargeBucket(&heapInfo->GetMediumBucket(sizeCat));
#endif
        SaveCurrentAtIndex(i + HeapConstants::BucketCount);
        MergeCurrentStats();
    }
#endif

    ResetCurrentStats();
    DumpLargeBucket(&heapInfo->largeObjectBucket);
    SaveCurrentAsLargeBlock();
    MergeCurrentStats();
    SaveSummary();
    return dumpObject;
}